

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Date tomorrow;
  Date today;
  
  Date::Date(&today,0x7cc,dec,5);
  tomorrow.d = today.d;
  tomorrow.y = today.y;
  tomorrow.m = today.m;
  Date::add_year(&tomorrow,0x17);
  Date::add_month(&tomorrow,5);
  poVar1 = operator<<((ostream *)&std::cout,&today);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = operator<<(poVar1,&tomorrow);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
	Date today{ 1996, Month::dec, 5 };
	Date tomorrow = today;

	try
	{
		tomorrow.add_year(23);
		tomorrow.add_month(5);
		std::cout << today
			<< '\n' << tomorrow << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}